

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParsePEReference(xmlParserCtxtPtr ctxt)

{
  xmlGenericErrorFunc p_Var1;
  getParameterEntitySAXFunc p_Var2;
  int iVar3;
  xmlCharEncoding enc;
  xmlChar *pxVar4;
  int *piVar5;
  xmlGenericErrorFunc *pp_Var6;
  void **ppvVar7;
  xmlEntityPtr ent;
  xmlParserInputPtr input;
  xmlChar *in_R8;
  xmlChar start [4];
  xmlChar local_1c;
  xmlChar local_1b;
  xmlChar local_1a;
  xmlChar local_19;
  
  if (*ctxt->input->cur == '%') {
    xmlNextChar(ctxt);
    pxVar4 = xmlParseName(ctxt);
    if (pxVar4 == (xmlChar *)0x0) {
      xmlFatalErrMsg(ctxt,XML_ERR_PEREF_NO_NAME,"PEReference: no name\n");
      return;
    }
    piVar5 = __xmlParserDebugEntities();
    if (*piVar5 != 0) {
      pp_Var6 = __xmlGenericError();
      p_Var1 = *pp_Var6;
      ppvVar7 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar7,"PEReference: %s\n",pxVar4);
    }
    if (*ctxt->input->cur != ';') {
      xmlFatalErr(ctxt,XML_ERR_PEREF_SEMICOL_MISSING,(char *)0x0);
      return;
    }
    xmlNextChar(ctxt);
    ctxt->nbentities = ctxt->nbentities + 1;
    if ((ctxt->sax == (_xmlSAXHandler *)0x0) ||
       (p_Var2 = ctxt->sax->getParameterEntity, p_Var2 == (getParameterEntitySAXFunc)0x0)) {
      ent = (xmlEntityPtr)0x0;
    }
    else {
      ent = (*p_Var2)(ctxt->userData,pxVar4);
    }
    if (ctxt->instate != XML_PARSER_EOF) {
      if (ent == (xmlEntityPtr)0x0) {
        if ((ctxt->standalone == 1) || ((ctxt->hasExternalSubset == 0 && (ctxt->hasPErefs == 0)))) {
          xmlFatalErrMsgStr(ctxt,XML_ERR_UNDECLARED_ENTITY,"PEReference: %%%s; not found\n",pxVar4);
        }
        else {
          if ((ctxt->validate == 0) || ((ctxt->vctxt).error == (xmlValidityErrorFunc)0x0)) {
            xmlWarningMsg(ctxt,XML_WAR_UNDECLARED_ENTITY,"PEReference: %%%s; not found\n",pxVar4,
                          in_R8);
          }
          else {
            xmlValidityError(ctxt,XML_WAR_UNDECLARED_ENTITY,"PEReference: %%%s; not found\n",pxVar4,
                             (xmlChar *)0x0);
          }
          ctxt->valid = 0;
        }
        xmlParserEntityCheck(ctxt,0,(xmlEntityPtr)0x0,0);
      }
      else if ((ent->etype & ~XML_INTERNAL_GENERAL_ENTITY) == XML_INTERNAL_PARAMETER_ENTITY) {
        iVar3 = xmlParserEntityCheck(ctxt,0,ent,0);
        if (iVar3 != 0) {
          return;
        }
        if ((((ent->etype == XML_EXTERNAL_PARAMETER_ENTITY) && ((ctxt->options & 0x1e) == 0)) &&
            (ctxt->replaceEntities == 0)) && (ctxt->validate == 0)) {
          return;
        }
        input = xmlNewEntityInputStream(ctxt,ent);
        iVar3 = xmlPushInput(ctxt,input);
        if (iVar3 < 0) {
          xmlFreeInputStream(input);
          return;
        }
        if (ent->etype == XML_EXTERNAL_PARAMETER_ENTITY) {
          if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa))
          {
            xmlGROW(ctxt);
          }
          if (ctxt->instate == XML_PARSER_EOF) {
            return;
          }
          pxVar4 = ctxt->input->cur;
          if (3 < (long)ctxt->input->end - (long)pxVar4) {
            local_1c = *pxVar4;
            local_1b = pxVar4[1];
            local_1a = pxVar4[2];
            local_19 = pxVar4[3];
            enc = xmlDetectCharEncoding(&local_1c,4);
            if (enc != XML_CHAR_ENCODING_NONE) {
              xmlSwitchEncoding(ctxt,enc);
            }
          }
          pxVar4 = ctxt->input->cur;
          if ((((*pxVar4 == '<') && (pxVar4[1] == '?')) &&
              ((pxVar4[2] == 'x' &&
               (((pxVar4[3] == 'm' && (pxVar4[4] == 'l')) && ((ulong)pxVar4[5] < 0x21)))))) &&
             ((0x100002600U >> ((ulong)pxVar4[5] & 0x3f) & 1) != 0)) {
            xmlParseTextDecl(ctxt);
          }
        }
      }
      else {
        xmlWarningMsg(ctxt,XML_WAR_UNDECLARED_ENTITY,"Internal: %%%s; is not a parameter entity\n",
                      pxVar4,in_R8);
      }
      ctxt->hasPErefs = 1;
    }
  }
  return;
}

Assistant:

void
xmlParsePEReference(xmlParserCtxtPtr ctxt)
{
    const xmlChar *name;
    xmlEntityPtr entity = NULL;
    xmlParserInputPtr input;

    if (RAW != '%')
        return;
    NEXT;
    name = xmlParseName(ctxt);
    if (name == NULL) {
	xmlFatalErrMsg(ctxt, XML_ERR_PEREF_NO_NAME, "PEReference: no name\n");
	return;
    }
    if (xmlParserDebugEntities)
	xmlGenericError(xmlGenericErrorContext,
		"PEReference: %s\n", name);
    if (RAW != ';') {
	xmlFatalErr(ctxt, XML_ERR_PEREF_SEMICOL_MISSING, NULL);
        return;
    }

    NEXT;

    /*
     * Increase the number of entity references parsed
     */
    ctxt->nbentities++;

    /*
     * Request the entity from SAX
     */
    if ((ctxt->sax != NULL) &&
	(ctxt->sax->getParameterEntity != NULL))
	entity = ctxt->sax->getParameterEntity(ctxt->userData, name);
    if (ctxt->instate == XML_PARSER_EOF)
	return;
    if (entity == NULL) {
	/*
	 * [ WFC: Entity Declared ]
	 * In a document without any DTD, a document with only an
	 * internal DTD subset which contains no parameter entity
	 * references, or a document with "standalone='yes'", ...
	 * ... The declaration of a parameter entity must precede
	 * any reference to it...
	 */
	if ((ctxt->standalone == 1) ||
	    ((ctxt->hasExternalSubset == 0) &&
	     (ctxt->hasPErefs == 0))) {
	    xmlFatalErrMsgStr(ctxt, XML_ERR_UNDECLARED_ENTITY,
			      "PEReference: %%%s; not found\n",
			      name);
	} else {
	    /*
	     * [ VC: Entity Declared ]
	     * In a document with an external subset or external
	     * parameter entities with "standalone='no'", ...
	     * ... The declaration of a parameter entity must
	     * precede any reference to it...
	     */
            if ((ctxt->validate) && (ctxt->vctxt.error != NULL)) {
                xmlValidityError(ctxt, XML_WAR_UNDECLARED_ENTITY,
                                 "PEReference: %%%s; not found\n",
                                 name, NULL);
            } else
                xmlWarningMsg(ctxt, XML_WAR_UNDECLARED_ENTITY,
                              "PEReference: %%%s; not found\n",
                              name, NULL);
            ctxt->valid = 0;
	}
	xmlParserEntityCheck(ctxt, 0, NULL, 0);
    } else {
	/*
	 * Internal checking in case the entity quest barfed
	 */
	if ((entity->etype != XML_INTERNAL_PARAMETER_ENTITY) &&
	    (entity->etype != XML_EXTERNAL_PARAMETER_ENTITY)) {
	    xmlWarningMsg(ctxt, XML_WAR_UNDECLARED_ENTITY,
		  "Internal: %%%s; is not a parameter entity\n",
			  name, NULL);
	} else {
            xmlChar start[4];
            xmlCharEncoding enc;

	    if (xmlParserEntityCheck(ctxt, 0, entity, 0))
	        return;

	    if ((entity->etype == XML_EXTERNAL_PARAMETER_ENTITY) &&
	        ((ctxt->options & XML_PARSE_NOENT) == 0) &&
		((ctxt->options & XML_PARSE_DTDVALID) == 0) &&
		((ctxt->options & XML_PARSE_DTDLOAD) == 0) &&
		((ctxt->options & XML_PARSE_DTDATTR) == 0) &&
		(ctxt->replaceEntities == 0) &&
		(ctxt->validate == 0))
		return;

	    input = xmlNewEntityInputStream(ctxt, entity);
	    if (xmlPushInput(ctxt, input) < 0) {
                xmlFreeInputStream(input);
		return;
            }

	    if (entity->etype == XML_EXTERNAL_PARAMETER_ENTITY) {
                /*
                 * Get the 4 first bytes and decode the charset
                 * if enc != XML_CHAR_ENCODING_NONE
                 * plug some encoding conversion routines.
                 * Note that, since we may have some non-UTF8
                 * encoding (like UTF16, bug 135229), the 'length'
                 * is not known, but we can calculate based upon
                 * the amount of data in the buffer.
                 */
                GROW
                if (ctxt->instate == XML_PARSER_EOF)
                    return;
                if ((ctxt->input->end - ctxt->input->cur)>=4) {
                    start[0] = RAW;
                    start[1] = NXT(1);
                    start[2] = NXT(2);
                    start[3] = NXT(3);
                    enc = xmlDetectCharEncoding(start, 4);
                    if (enc != XML_CHAR_ENCODING_NONE) {
                        xmlSwitchEncoding(ctxt, enc);
                    }
                }

                if ((CMP5(CUR_PTR, '<', '?', 'x', 'm', 'l')) &&
                    (IS_BLANK_CH(NXT(5)))) {
                    xmlParseTextDecl(ctxt);
                }
            }
	}
    }
    ctxt->hasPErefs = 1;
}